

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O3

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::SelectCoins
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,CoinSelection *this
          ,AmountMap *map_target_value,vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *utxos,
          UtxoFilter *filter,CoinSelectionOption *option_params,Amount *tx_fee_value,
          AmountMap *map_select_value,Amount *utxo_fee_value,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *map_searched_bnb,AmountMap *map_utxo_fee_value)

{
  _Rb_tree_node_base *__k;
  _Base_ptr p_Var1;
  _Alloc_hider _Var2;
  undefined8 *puVar3;
  char cVar4;
  int iVar5;
  iterator iVar6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  CfdException *pCVar10;
  pointer pUVar11;
  bool bVar12;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *result;
  AmountMap work_selected_values;
  AmountMap work_map_utxo_fee_value;
  AmountMap work_target_values;
  anon_class_168_9_d2d4f853 coin_selection_function;
  ConfidentialAssetId fee_asset;
  int64_t target_value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
  asset_utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  work_searched_bnb;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> work_utxos;
  Amount tx_fee_out;
  Amount work_utxo_fee;
  key_type local_2b8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *local_298;
  _Rb_tree_node_base *local_290;
  undefined1 local_288 [32];
  _Base_ptr local_268;
  size_t local_260;
  uint64_t local_258;
  CoinSelectionOption *local_250;
  undefined1 local_248 [8];
  Utxo **ppUStack_240;
  _Base_ptr local_238;
  _Base_ptr local_230;
  _Base_ptr local_228;
  size_t local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  local_210;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  uint64_t local_1c0;
  uint64_t uStack_1b8;
  int64_t local_1b0;
  int64_t iStack_1a8;
  bool local_1a0;
  ConfidentialAssetId local_198;
  undefined8 local_170;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *local_168;
  Amount *local_160;
  AmountMap *local_158;
  Amount *local_150;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *local_148;
  AmountMap *local_140;
  ConfidentialAssetId local_138;
  CoinSelection *local_110;
  UtxoFilter *local_108;
  Utxo *local_100;
  mapped_type local_f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
  local_f0;
  string local_c0;
  undefined8 *local_a0;
  _Rb_tree_node_base local_98;
  size_t local_78;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_40;
  Amount local_38;
  
  local_258 = option_params->effective_fee_baserate_;
  local_298 = utxos;
  local_110 = this;
  local_108 = filter;
  if (local_258 != 0) {
    cfd::core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)local_1e0,&option_params->fee_asset_);
    cVar4 = cfd::core::ConfidentialAssetId::IsEmpty();
    local_1e0._0_8_ = &PTR__ConfidentialAssetId_002b0ea0;
    if ((void *)CONCAT44(local_1e0._12_4_,local_1e0._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
    }
    if (cVar4 != '\0') {
      local_f0._M_impl._0_8_ = "cfd_utxo.cpp";
      local_f0._M_impl.super__Rb_tree_header._M_header._M_color = 0x13e;
      local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x265dc5;
      local_288._0_8_ = option_params->effective_fee_baserate_;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_1e0,&option_params->fee_asset_);
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      core::logger::log<unsigned_long&,std::__cxx11::string&>
                ((CfdSourceLocation *)&local_f0,kCfdLogLevelWarning,
                 "Failed to SelectCoins. Fee calculation option error.: effective_fee_base_rate=[{}], fee_asset=[{}]"
                 ,(unsigned_long *)local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210);
      if ((_Base_ptr *)local_210._M_impl._0_8_ !=
          &local_210._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_210._M_impl._0_8_);
      }
      local_1e0._0_8_ = &PTR__ConfidentialAssetId_002b0ea0;
      if ((void *)CONCAT44(local_1e0._12_4_,local_1e0._8_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
      }
      pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = &local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Failed to SelectCoins. Fee calculation option error.","");
      core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)local_1e0);
      __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  if (map_select_value == (AmountMap *)0x0) {
    local_1e0._0_8_ = "cfd_utxo.cpp";
    local_1e0._8_4_ = 0x148;
    local_1d0._M_allocated_capacity = 0x265dc5;
    core::logger::log<>((CfdSourceLocation *)local_1e0,kCfdLogLevelWarning,
                        "Failed to SelectCoins. map_select_value is empty.");
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e0._0_8_ = &local_1d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"Failed to SelectCoins. map_select_value is empty.","");
    core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)local_1e0);
    __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::_Rb_tree(&local_210,&map_target_value->_M_t);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_138);
  if ((local_258 != 0) && (option_params->has_ignore_fee_asset_ == false)) {
    cfd::core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)local_1e0,&option_params->fee_asset_);
    cfd::core::ConfidentialAssetId::operator=(&local_138,(ConfidentialAssetId *)local_1e0);
    local_1e0._0_8_ = &PTR__ConfidentialAssetId_002b0ea0;
    if ((void *)CONCAT44(local_1e0._12_4_,local_1e0._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
    }
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
            ::find(&local_210,(key_type *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ != &local_1d0) {
      operator_delete((void *)local_1e0._0_8_);
    }
    if ((_Rb_tree_header *)iVar6._M_node == &local_210._M_impl.super__Rb_tree_header) {
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_f0._M_impl._0_8_ = local_f0._M_impl._0_8_ & 0xffffffff00000000;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
      ::_M_emplace_unique<std::__cxx11::string,int>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                  *)&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                 (int *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._0_8_ != &local_1d0) {
        operator_delete((void *)local_1e0._0_8_);
      }
    }
  }
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector(&local_70,local_298);
  local_250 = option_params;
  if ((_Rb_tree_header *)local_210._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_210._M_impl.super__Rb_tree_header) {
    p_Var7 = local_210._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_290 = p_Var7 + 1;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_1e0,(string *)local_290);
      cVar4 = cfd::core::ConfidentialAssetId::IsEmpty();
      if (cVar4 != '\0') {
        local_288._0_8_ = "cfd_utxo.cpp";
        local_288._8_4_ = 0x160;
        local_288._16_8_ = "SelectCoins";
        core::logger::log<>((CfdSourceLocation *)local_288,kCfdLogLevelWarning,
                            "Failed to SelectCoins. Target asset is empty.");
        pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
        local_288._0_8_ = local_288 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"Failed to SelectCoins. Target asset is empty.","");
        core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)local_288);
        __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      local_248 = (undefined1  [8])0x0;
      ppUStack_240 = (Utxo **)0x0;
      local_238 = (_Base_ptr)0x0;
      std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::reserve
                ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)local_248,
                 ((long)(local_298->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_298->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      local_100 = local_70.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      pUVar11 = local_70.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_70.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_70.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_2b8,
                     pUVar11->asset,&pUVar11->field_0xaa,(allocator_type *)local_288);
          cfd::core::ByteData::ByteData((ByteData *)&local_c0,(vector *)&local_2b8);
          cfd::core::ConfidentialAssetId::ConfidentialAssetId
                    ((ConfidentialAssetId *)local_288,(ByteData *)&local_c0);
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
          puVar3 = local_a0;
          p_Var1 = p_Var7[1]._M_parent;
          if (p_Var1 == (_Base_ptr)CONCAT44(local_98._4_4_,local_98._M_color)) {
            if (p_Var1 == (_Base_ptr)0x0) {
              bVar12 = true;
            }
            else {
              iVar5 = bcmp(*(void **)local_290,local_a0,(size_t)p_Var1);
              bVar12 = iVar5 == 0;
            }
          }
          else {
            bVar12 = false;
          }
          if ((_Base_ptr *)puVar3 != &local_98._M_parent) {
            operator_delete(puVar3);
          }
          local_288._0_8_ = &PTR__ConfidentialAssetId_002b0ea0;
          if ((void *)CONCAT44(local_288._12_4_,local_288._8_4_) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_288._12_4_,local_288._8_4_));
          }
          if (local_c0._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          if (bVar12) {
            local_288._0_8_ = pUVar11;
            if ((_Base_ptr)ppUStack_240 == local_238) {
              std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>::_M_realloc_insert<cfd::Utxo*>
                        ((vector<cfd::Utxo*,std::allocator<cfd::Utxo*>> *)local_248,
                         (iterator)ppUStack_240,(Utxo **)local_288);
            }
            else {
              *ppUStack_240 = pUVar11;
              ppUStack_240 = ppUStack_240 + 1;
            }
          }
          if (local_2b8._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_2b8._M_dataplus._M_p);
          }
          pUVar11 = pUVar11 + 1;
        } while (pUVar11 != local_100);
      }
      if ((undefined1  [8])ppUStack_240 == local_248) {
        local_288._0_8_ = "cfd_utxo.cpp";
        local_288._8_4_ = 0x172;
        local_288._16_8_ = "SelectCoins";
        core::logger::log<std::__cxx11::string_const&>
                  ((CfdSourceLocation *)local_288,kCfdLogLevelWarning,
                   "Failed to SelectCoins. Target asset is not found in utxo list.target_asset=[{}]"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290);
        pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
        local_288._0_8_ = local_288 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,
                   "Failed to SelectCoins. Target asset is not found in utxo list.","");
        core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)local_288);
        __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>>
      ::
      _M_emplace_unique<std::__cxx11::string_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>>
                  *)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                 (vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)local_248);
      option_params = local_250;
      if (local_248 != (undefined1  [8])0x0) {
        operator_delete((void *)local_248);
      }
      local_1e0._0_8_ = &PTR__ConfidentialAssetId_002b0ea0;
      if ((void *)CONCAT44(local_1e0._12_4_,local_1e0._8_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_210._M_impl.super__Rb_tree_header);
  }
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::reserve
            (__return_storage_ptr__,
             ((long)(local_298->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(local_298->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
  local_58 = *(undefined8 *)tx_fee_value;
  uStack_50 = *(undefined8 *)(tx_fee_value + 8);
  local_288._24_8_ = local_288 + 8;
  local_288._8_4_ = _S_red;
  local_288._16_8_ = (_Base_ptr)0x0;
  local_260 = 0;
  local_268 = (_Base_ptr)local_288._24_8_;
  cfd::core::Amount::Amount((Amount *)&local_40);
  local_98._M_left = &local_98;
  local_98._M_color = _S_red;
  local_98._M_parent = (_Base_ptr)0x0;
  local_78 = 0;
  local_230 = (_Base_ptr)&ppUStack_240;
  ppUStack_240 = (Utxo **)((ulong)ppUStack_240 & 0xffffffff00000000);
  local_238 = (_Base_ptr)0x0;
  local_220 = 0;
  local_1e0._0_8_ = local_110;
  local_1e0._8_4_ = local_108->reserved;
  local_1d0._M_allocated_capacity = *(undefined8 *)option_params;
  local_1d0._8_8_ = *(undefined8 *)&option_params->change_spend_size_;
  local_1c0 = option_params->effective_fee_baserate_;
  uStack_1b8 = option_params->long_term_fee_baserate_;
  local_1b0 = option_params->knapsack_minimum_change_;
  iStack_1a8 = option_params->dust_fee_rate_;
  local_1a0 = option_params->has_ignore_fee_asset_;
  local_228 = local_230;
  local_98._M_right = local_98._M_left;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_198,&option_params->fee_asset_);
  local_170._0_4_ = option_params->exponent_;
  local_170._4_4_ = option_params->minimum_bits_;
  local_160 = (Amount *)&local_58;
  local_158 = (AmountMap *)local_288;
  local_148 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)&local_a0;
  local_140 = (AmountMap *)local_248;
  local_168 = __return_storage_ptr__;
  local_150 = (Amount *)&local_40;
  if ((_Rb_tree_header *)local_210._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_210._M_impl.super__Rb_tree_header) {
    p_Var7 = local_210._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      _Var2._M_p = local_2b8._M_dataplus._M_p;
      __k = p_Var7 + 1;
      p_Var1 = p_Var7[1]._M_parent;
      if (p_Var1 == (_Base_ptr)local_2b8._M_string_length) {
        if (p_Var1 == (_Base_ptr)0x0) {
          bVar12 = true;
        }
        else {
          iVar5 = bcmp(*(void **)__k,local_2b8._M_dataplus._M_p,(size_t)p_Var1);
          bVar12 = iVar5 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_2b8.field_2) {
        operator_delete(_Var2._M_p);
      }
      option_params = local_250;
      if (!bVar12) {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
                               *)&local_f0,(key_type *)__k);
        cfd::core::Amount::Amount((Amount *)&local_2b8);
        SelectCoins::anon_class_168_9_d2d4f853::operator()
                  ((anon_class_168_9_d2d4f853 *)local_1e0,(int64_t *)(p_Var7 + 2),pmVar8,
                   (Amount *)&local_2b8,(string *)__k,false);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_210._M_impl.super__Rb_tree_header);
  }
  if ((local_258 != 0) && (option_params->has_ignore_fee_asset_ == false)) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)&local_210,&local_2b8);
    local_f8 = *pmVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
                           *)&local_f0,&local_2b8);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    SelectCoins::anon_class_168_9_d2d4f853::operator()
              ((anon_class_168_9_d2d4f853 *)local_1e0,&local_f8,pmVar8,(Amount *)&local_58,&local_c0
               ,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::operator=(&map_select_value->_M_t,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)local_288);
  if (utxo_fee_value != (Amount *)0x0) {
    utxo_fee_value[8] = local_38;
    *(undefined8 *)utxo_fee_value = local_40;
  }
  if (map_searched_bnb !=
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::operator=(&map_searched_bnb->_M_t,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)&local_a0);
  }
  if (map_utxo_fee_value != (AmountMap *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator=(&map_utxo_fee_value->_M_t,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 *)local_248);
  }
  local_198._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002b0ea0;
  if (local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)local_248);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)&local_a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)local_288);
  if (local_70.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start != (Utxo *)0x0) {
    operator_delete(local_70.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
  ::~_Rb_tree(&local_f0);
  local_138._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002b0ea0;
  if (local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&local_210);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Utxo> CoinSelection::SelectCoins(
    const AmountMap& map_target_value, const std::vector<Utxo>& utxos,
    const UtxoFilter& filter, const CoinSelectionOption& option_params,
    const Amount& tx_fee_value, AmountMap* map_select_value,
    Amount* utxo_fee_value, std::map<std::string, bool>* map_searched_bnb,
    AmountMap* map_utxo_fee_value) {
  bool calculate_fee = (option_params.GetEffectiveFeeBaserate() != 0);
  if (calculate_fee && option_params.GetFeeAsset().IsEmpty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to SelectCoins. Fee calculation option error."
        ": effective_fee_base_rate=[{}], fee_asset=[{}]",
        option_params.GetEffectiveFeeBaserate(),
        option_params.GetFeeAsset().GetHex());
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Failed to SelectCoins. Fee calculation option error.");
  }
  if (map_select_value == nullptr) {
    warn(CFD_LOG_SOURCE, "Failed to SelectCoins. map_select_value is empty.");
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Failed to SelectCoins. map_select_value is empty.");
  }

  // add fee asset to target asset list
  AmountMap work_target_values = map_target_value;
  ConfidentialAssetId fee_asset;
  if (calculate_fee && (!option_params.HasIgnoreFeeAsset())) {
    fee_asset = option_params.GetFeeAsset();
    auto iter = work_target_values.find(fee_asset.GetHex());
    if (iter == std::end(work_target_values)) {
      work_target_values.emplace(fee_asset.GetHex(), 0);
    }
  }

  // asset exists check
  std::map<std::string, std::vector<Utxo*>> asset_utxos;
  std::vector<Utxo> work_utxos = utxos;
  for (auto& target : work_target_values) {
    // asset valid check...
    ConfidentialAssetId target_asset(target.first);
    if (target_asset.IsEmpty()) {
      warn(CFD_LOG_SOURCE, "Failed to SelectCoins. Target asset is empty.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to SelectCoins. Target asset is empty.");
    }

    // convert utxo list to ptr
    std::vector<Utxo*> p_utxos;
    p_utxos.reserve(utxos.size());
    for (auto& utxo : work_utxos) {
      std::vector<uint8_t> asset_byte(
          std::begin(utxo.asset), std::end(utxo.asset));
      if (target.first == ConfidentialAssetId(asset_byte).GetHex()) {
        p_utxos.push_back(&utxo);
      }
    }
    if (p_utxos.size() == 0) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to SelectCoins. Target asset is not found in utxo list."
          "target_asset=[{}]",
          target.first);
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to SelectCoins. Target asset is not found in utxo list.");
    }

    asset_utxos.emplace(target.first, p_utxos);
  }

  // coin selection function
  std::vector<Utxo> result;
  result.reserve(utxos.size());
  Amount tx_fee_out = tx_fee_value;
  AmountMap work_selected_values;
  Amount work_utxo_fee = Amount();
  std::map<std::string, bool> work_searched_bnb;
  AmountMap work_map_utxo_fee_value;
  auto coin_selection_function = [this, filter, option_params, &result,
                                  &tx_fee_out, &work_selected_values,
                                  &work_utxo_fee, &work_searched_bnb,
                                  &work_map_utxo_fee_value](
                                     const int64_t& target_value,
                                     const std::vector<Utxo*>& utxos,
                                     const Amount& tx_fee,
                                     const std::string& asset_id,
                                     bool consider_fee) {
    int64_t select_value_out = 0;
    Amount utxo_fee_out = Amount();
    bool use_bnb_out = false;
    std::vector<Utxo> ret_utxos = SelectCoinsMinConf(
        target_value, utxos, filter, option_params, tx_fee, consider_fee,
        &select_value_out, &utxo_fee_out, &use_bnb_out);
    std::copy(ret_utxos.begin(), ret_utxos.end(), std::back_inserter(result));
    tx_fee_out += utxo_fee_out;
    work_utxo_fee += utxo_fee_out;
    work_selected_values.emplace(asset_id, select_value_out);
    work_searched_bnb.emplace(asset_id, use_bnb_out);
    work_map_utxo_fee_value.emplace(asset_id, utxo_fee_out.GetSatoshiValue());
  };

  // do coin selection exclude fee asset
  for (auto& target : work_target_values) {
    // skip fee asset
    if (target.first == fee_asset.GetHex()) {
      continue;
    }

    // For assets other than fees, calculate without considering fees.
    const auto& target_value = target.second;
    coin_selection_function(
        target_value, asset_utxos[target.first], Amount(), target.first,
        false);
  }

  // do coin selection with fee asset
  if (calculate_fee && (!option_params.HasIgnoreFeeAsset())) {
    int64_t target_value = work_target_values[fee_asset.GetHex()];
    coin_selection_function(
        target_value, asset_utxos[fee_asset.GetHex()], tx_fee_out,
        fee_asset.GetHex(), true);
  }

  if (map_select_value != nullptr) {
    *map_select_value = work_selected_values;
  }
  if (utxo_fee_value != nullptr) {
    *utxo_fee_value = work_utxo_fee;
  }
  if (map_searched_bnb != nullptr) {
    *map_searched_bnb = work_searched_bnb;
  }
  if (map_utxo_fee_value != nullptr) {
    *map_utxo_fee_value = work_map_utxo_fee_value;
  }
  return result;
}